

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cc
# Opt level: O1

size_t xemmai::anon_unknown_18::f_expand(void ***a_pc,t_pvalue *a_stack,size_t a_n)

{
  t_object *ptVar1;
  t_object *ptVar2;
  t_pvalue *ptVar3;
  anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 aVar4;
  uintptr_t t;
  ulong uVar5;
  long lVar6;
  wchar_t *extraout_RDX;
  wchar_t *extraout_RDX_00;
  wchar_t *extraout_RDX_01;
  void *pvVar7;
  void ***pppvVar8;
  ulong uVar9;
  t_type_of<xemmai::t_object> *this;
  void *pvVar10;
  long in_FS_OFFSET;
  wstring_view a_message;
  wstring_view a_message_00;
  wstring_view a_message_01;
  wstring_view a_message_02;
  undefined1 auVar11 [16];
  t_pvalue x;
  void *local_58;
  t_pvalue *local_50;
  pthread_rwlock_t *local_48;
  t_pvalue local_40;
  
  if (a_stack == (t_pvalue *)0x0) {
    __assert_fail("a_n > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/code.cc"
                  ,0x1a,
                  "size_t xemmai::(anonymous namespace)::f_expand(void **&, t_pvalue *, size_t)");
  }
  pppvVar8 = a_pc + (long)a_stack * 2 + 2;
  ptVar1 = (t_object *)*pppvVar8;
  local_40.field_0 =
       *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)(a_pc + (long)a_stack * 2 + 3);
  local_40.super_t_pointer.v_p = ptVar1;
  if ((t_object *)0x4 < ptVar1) {
    if ((ptVar1->v_type->v_depth != 0) &&
       ((undefined8 *)ptVar1->v_type->v_ids[1] == &v__type_id<xemmai::t_tuple>)) {
      pvVar10 = *(void **)ptVar1->v_data;
      if (*(void ****)(in_FS_OFFSET + -0x30) < pppvVar8 + (long)pvVar10 * 2) {
        *(void ****)(in_FS_OFFSET + -0x30) = pppvVar8 + (long)pvVar10 * 2;
      }
      if (pvVar10 != (void *)0x0) {
        lVar6 = 0;
        pvVar7 = pvVar10;
        do {
          *(undefined8 *)((long)a_pc + lVar6 + (long)a_stack * 0x10 + 0x10) =
               *(undefined8 *)(ptVar1->v_data + lVar6 + 8);
          *(undefined8 *)((long)a_pc + lVar6 + (long)a_stack * 0x10 + 0x18) =
               *(undefined8 *)(ptVar1->v_data + lVar6 + 0x10);
          lVar6 = lVar6 + 0x10;
          pvVar7 = (void *)((long)pvVar7 + -1);
        } while (pvVar7 != (void *)0x0);
      }
      goto LAB_00156b03;
    }
    if ((((t_object *)0x4 < ptVar1) && (1 < ptVar1->v_type->v_depth)) &&
       ((undefined8 *)ptVar1->v_type->v_ids[2] == &v__type_id<xemmai::t_list>)) {
      local_50 = a_stack;
      if (*(long *)ptVar1->v_data == *(long *)(in_FS_OFFSET + -0x68)) {
        pvVar10 = *(void **)&ptVar1[1].v_color;
        if (*(void ****)(in_FS_OFFSET + -0x30) < pppvVar8 + (long)pvVar10 * 2) {
          *(void ****)(in_FS_OFFSET + -0x30) = pppvVar8 + (long)pvVar10 * 2;
        }
        if (pvVar10 != (void *)0x0) {
          pppvVar8 = a_pc + (long)a_stack * 2 + 3;
          pvVar7 = (void *)0x0;
          do {
            local_58 = pvVar7;
            t_list::f_validate((t_list *)ptVar1->v_data,(intptr_t *)&local_58);
            uVar5 = (long)local_58 + (long)((ptVar1[1].v_scan)->v_data + -0x48);
            ptVar2 = ptVar1[1].v_previous;
            uVar9 = 0;
            if (*(ulong *)ptVar2->v_data <= uVar5) {
              uVar9 = *(ulong *)ptVar2->v_data;
            }
            lVar6 = (uVar5 - uVar9) * 0x10;
            pppvVar8[-1] = *(void ***)((long)ptVar2 + lVar6 + 0x50);
            *pppvVar8 = *(void ***)((long)ptVar2 + lVar6 + 0x58);
            pvVar7 = (void *)((long)pvVar7 + 1);
            pppvVar8 = pppvVar8 + 2;
            a_stack = local_50;
          } while (pvVar10 != pvVar7);
        }
      }
      else {
        if (*(long *)ptVar1->v_data != 0) {
          a_message_01._M_str = (wchar_t *)a_n;
          a_message_01._M_len = (size_t)L"owned by another thread.";
          f_throw((xemmai *)0x18,a_message_01);
        }
        local_48 = (pthread_rwlock_t *)(ptVar1->v_data + 8);
        std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_48->__data);
        if (*(long *)ptVar1->v_data != 0) {
          a_message_02._M_str = extraout_RDX_00;
          a_message_02._M_len = (size_t)L"owned by another thread.";
          f_throw((xemmai *)0x18,a_message_02);
        }
        pvVar10 = *(void **)&ptVar1[1].v_color;
        if (*(void ****)(in_FS_OFFSET + -0x30) < pppvVar8 + (long)pvVar10 * 2) {
          *(void ****)(in_FS_OFFSET + -0x30) = pppvVar8 + (long)pvVar10 * 2;
        }
        if (pvVar10 != (void *)0x0) {
          pppvVar8 = a_pc + (long)a_stack * 2 + 3;
          pvVar7 = (void *)0x0;
          do {
            local_58 = pvVar7;
            t_list::f_validate((t_list *)ptVar1->v_data,(intptr_t *)&local_58);
            uVar5 = (long)local_58 + (long)((ptVar1[1].v_scan)->v_data + -0x48);
            ptVar2 = ptVar1[1].v_previous;
            uVar9 = 0;
            if (*(ulong *)ptVar2->v_data <= uVar5) {
              uVar9 = *(ulong *)ptVar2->v_data;
            }
            lVar6 = (uVar5 - uVar9) * 0x10;
            pppvVar8[-1] = *(void ***)((long)ptVar2 + lVar6 + 0x50);
            *pppvVar8 = *(void ***)((long)ptVar2 + lVar6 + 0x58);
            pvVar7 = (void *)((long)pvVar7 + 1);
            pppvVar8 = pppvVar8 + 2;
          } while (pvVar10 != pvVar7);
        }
        pthread_rwlock_unlock(local_48);
        a_stack = local_50;
      }
      goto LAB_00156b03;
    }
  }
  ptVar2 = *(t_object **)(*(long *)(in_FS_OFFSET + -0x78) + 0x2e0);
  ptVar3 = *(t_pvalue **)(in_FS_OFFSET + -0x30);
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar3 + 2;
  ptVar3[1].super_t_pointer.v_p = (t_object *)0x0;
  if (ptVar1 < (t_object *)0x5) {
    this = *(t_type_of<xemmai::t_object> **)
            (*(long *)(in_FS_OFFSET + -0x78) + 0x10 + (long)ptVar1 * 8);
  }
  else {
    this = ptVar1->v_type;
  }
  t_type_of<xemmai::t_object>::f_invoke(this,&local_40,ptVar2,&f_expand::index,ptVar3,0);
  ptVar1 = (ptVar3->super_t_pointer).v_p;
  pvVar10 = (void *)(ptVar3->field_0).v_integer;
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar3;
  a_message._M_str = extraout_RDX;
  if ((ptVar1 != (t_object *)0x3) &&
     (((ptVar1 < (t_object *)0x3 || (ptVar1 == (t_object *)0x4)) ||
      ((ptVar1->v_type->v_depth == 0 ||
       (a_message._M_str = (wchar_t *)&v__type_id<long>,
       (undefined8 *)ptVar1->v_type->v_ids[1] != &v__type_id<long>)))))) {
    _GLOBAL__N_1::f_expand();
    a_message._M_str = extraout_RDX_01;
LAB_00156cf9:
    a_message_00._M_str = a_message._M_str;
    a_message_00._M_len = (size_t)L"not supported.";
    f_throw((xemmai *)0xe,a_message_00);
  }
  if ((t_object *)0x4 < ptVar1) {
    pvVar10 = *(void **)ptVar1->v_data;
  }
  if (ptVar3 < (t_pvalue *)(pppvVar8 + (long)pvVar10 * 2)) {
    *(t_pvalue **)(in_FS_OFFSET + -0x30) = (t_pvalue *)(pppvVar8 + (long)pvVar10 * 2);
  }
  if (pvVar10 != (void *)0x0) {
    pvVar7 = (void *)0x0;
    do {
      if (local_40.super_t_pointer.v_p < (t_object *)0x5) goto LAB_00156cf9;
      ptVar3 = *(t_pvalue **)(in_FS_OFFSET + -0x30);
      *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar3 + 3;
      ptVar3[2].super_t_pointer.v_p = (t_object *)0x3;
      ptVar3[2].field_0.v_integer = (intptr_t)pvVar7;
      auVar11 = (undefined1  [16])
                (*(local_40.super_t_pointer.v_p)->v_type->f_get_at)
                          (local_40.super_t_pointer.v_p,ptVar3);
      while( true ) {
        a_message._M_str = auVar11._8_8_;
        if (auVar11._0_8_ == 0xffffffffffffffff) break;
        ptVar1 = (ptVar3->super_t_pointer).v_p;
        if (ptVar1 < (t_object *)0x5) {
          a_message._M_len = (size_t)L"not supported.";
          f_throw((xemmai *)0xe,a_message);
        }
        auVar11 = (undefined1  [16])(*ptVar1->v_type->f_call)(ptVar1,ptVar3,auVar11._0_8_);
      }
      ptVar1 = (ptVar3->super_t_pointer).v_p;
      aVar4 = ptVar3->field_0;
      *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar3;
      pppvVar8[(long)pvVar7 * 2] = &ptVar1->v_next;
      *(anon_union_8_2_8dc3d723_for_t_value<xemmai::t_pointer>_2 *)(pppvVar8 + (long)pvVar7 * 2 + 1)
           = aVar4;
      pvVar7 = (void *)((long)pvVar7 + 1);
    } while (pvVar7 != pvVar10);
  }
LAB_00156b03:
  return (size_t)((long)pvVar10 + (long)((long)&a_stack[-1].field_0 + 7));
}

Assistant:

size_t f_expand(void**& a_pc, t_pvalue* a_stack, size_t a_n)
{
	assert(a_n > 0);
	a_stack += a_n + 1;
	auto x = a_stack[0];
	size_t n;
	if (f_is<t_tuple>(x)) {
		auto& tuple = x->f_as<t_tuple>();
		n = tuple.f_size();
		f_allocate(a_stack, n);
		for (size_t i = 0; i < n; ++i) a_stack[i] = tuple[i];
	} else if (f_is<t_list>(x)) {
		auto& list = x->f_as<t_list>();
		list.f_owned_or_shared<std::shared_lock>([&]
		{
			n = list.f_size();
			f_allocate(a_stack, n);
			for (size_t i = 0; i < n; ++i) a_stack[i] = list[i];
		});
	} else {
		static size_t index;
		auto size = x.f_invoke(f_global()->f_symbol_size(), index);
		f_check<size_t>(size, L"size");
		n = f_as<size_t>(size);
		f_allocate(a_stack, n);
		for (size_t i = 0; i < n; ++i) a_stack[i] = x.f_get_at(i);
	}
	return a_n - 1 + n;
}